

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O2

int32 gauden_mllr_transform(gauden_t *g,ps_mllr_t *mllr,ps_config_t *config)

{
  int32 **out_veclen;
  int32 *out_n_feat;
  int *piVar1;
  int *piVar2;
  uint uVar3;
  logmath_t *lmath;
  char *pcVar4;
  float ****ppppfVar5;
  void *ptr;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  uint local_60;
  uint local_5c;
  int32 *local_58;
  ps_config_t *local_50;
  int32 *local_48;
  int32 *flen;
  int local_34;
  
  if (g->mean != (mfcc_t ****)0x0) {
    gauden_param_free(g->mean);
  }
  if (g->var != (mfcc_t ****)0x0) {
    gauden_param_free(g->var);
  }
  if (g->det != (mfcc_t ***)0x0) {
    ckd_free_3d(g->det);
  }
  out_veclen = &g->featlen;
  if (g->featlen != (int32 *)0x0) {
    ckd_free(g->featlen);
  }
  g->det = (mfcc_t ***)0x0;
  g->featlen = (int32 *)0x0;
  pcVar4 = ps_config_str(config,"mean");
  local_48 = &g->n_mgau;
  out_n_feat = &g->n_feat;
  local_58 = &g->n_density;
  ppppfVar5 = gauden_param_read(pcVar4,local_48,out_n_feat,local_58,out_veclen);
  g->mean = (mfcc_t ****)ppppfVar5;
  pcVar4 = ps_config_str(config,"var");
  ppppfVar5 = gauden_param_read(pcVar4,&local_34,(int32 *)&local_5c,(int32 *)&local_60,&flen);
  g->var = (mfcc_t ****)ppppfVar5;
  if (((local_34 == g->n_mgau) && (local_5c == *out_n_feat)) && (local_60 == *local_58)) {
    uVar8 = 0;
    uVar6 = (ulong)local_5c;
    if ((int)local_5c < 1) {
      uVar6 = uVar8;
    }
    do {
      if (uVar6 == uVar8) {
        local_50 = config;
        ckd_free(flen);
        for (lVar7 = 0; lVar7 < *local_48; lVar7 = lVar7 + 1) {
          for (lVar12 = 0; lVar12 < *out_n_feat; lVar12 = lVar12 + 1) {
            ptr = __ckd_calloc__((long)(*out_veclen)[lVar12],8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                 ,0x222);
            uVar6 = (ulong)(uint)*local_58;
            if (*local_58 < 1) {
              uVar6 = 0;
            }
            for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
              uVar3 = (*out_veclen)[lVar12];
              uVar9 = 0;
              if (0 < (int)uVar3) {
                uVar9 = (ulong)uVar3;
              }
              for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
                dVar13 = 0.0;
                for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
                  dVar13 = dVar13 + (double)((float)(*mllr->A[lVar12])[uVar10][uVar11] *
                                            (float)g->mean[lVar7][lVar12][uVar8][uVar11]);
                  *(double *)((long)ptr + uVar10 * 8) = dVar13;
                }
                *(double *)((long)ptr + uVar10 * 8) =
                     dVar13 + (double)(float)(*mllr->b[lVar12])[uVar10];
              }
              for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
                g->mean[lVar7][lVar12][uVar8][uVar10] =
                     (mfcc_t)(float)*(double *)((long)ptr + uVar10 * 8);
                g->var[lVar7][lVar12][uVar8][uVar10] =
                     (mfcc_t)((float)(*mllr->h[lVar12])[uVar10] *
                             (float)g->var[lVar7][lVar12][uVar8][uVar10]);
              }
            }
            ckd_free(ptr);
          }
        }
        lmath = g->lmath;
        dVar13 = ps_config_float(local_50,"varfloor");
        gauden_dist_precompute(g,lmath,(float32)(float)dVar13);
        return 0;
      }
      piVar1 = *out_veclen + uVar8;
      piVar2 = flen + uVar8;
      uVar8 = uVar8 + 1;
    } while (*piVar1 == *piVar2);
    pcVar4 = "Feature lengths for means and variances differ\n";
    lVar7 = 0x21b;
  }
  else {
    pcVar4 = "Mixture-gaussians dimensions for means and variances differ\n";
    lVar7 = 0x218;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
          ,lVar7,pcVar4);
  exit(1);
}

Assistant:

int32
gauden_mllr_transform(gauden_t *g, ps_mllr_t *mllr, ps_config_t *config)
{
    int32 i, m, f, d, *flen;

    /* Free data if already here */
    if (g->mean)
        gauden_param_free(g->mean);
    if (g->var)
        gauden_param_free(g->var);
    if (g->det)
        ckd_free_3d(g->det);
    if (g->featlen)
        ckd_free(g->featlen);
    g->det = NULL;
    g->featlen = NULL;

    /* Reload means and variances (un-precomputed). */
    g->mean = (mfcc_t ****)gauden_param_read(ps_config_str(config, "mean"), &g->n_mgau, &g->n_feat, &g->n_density,
                      &g->featlen);
    g->var = (mfcc_t ****)gauden_param_read(ps_config_str(config, "var"), &m, &f, &d, &flen);

    /* Verify mean and variance parameter dimensions */
    if ((m != g->n_mgau) || (f != g->n_feat) || (d != g->n_density))
        E_FATAL
            ("Mixture-gaussians dimensions for means and variances differ\n");
    for (i = 0; i < g->n_feat; i++)
        if (g->featlen[i] != flen[i])
            E_FATAL("Feature lengths for means and variances differ\n");
    ckd_free(flen);

    /* Transform codebook for each stream s */
    for (i = 0; i < g->n_mgau; ++i) {
        for (f = 0; f < g->n_feat; ++f) {
            float64 *temp;
            temp = (float64 *) ckd_calloc(g->featlen[f], sizeof(float64));
            /* Transform each density d in selected codebook */
            for (d = 0; d < g->n_density; d++) {
                int l;
                for (l = 0; l < g->featlen[f]; l++) {
                    temp[l] = 0.0;
                    for (m = 0; m < g->featlen[f]; m++) {
                        /* FIXME: For now, only one class, hence the zeros below. */
                        temp[l] += mllr->A[f][0][l][m] * g->mean[i][f][d][m];
                    }
                    temp[l] += mllr->b[f][0][l];
                }

                for (l = 0; l < g->featlen[f]; l++) {
                    g->mean[i][f][d][l] = (float32) temp[l];
                    g->var[i][f][d][l] *= mllr->h[f][0][l];
                }
            }
            ckd_free(temp);
        }
    }

    /* Re-precompute (if we aren't adapting variances this isn't
     * actually necessary...) */
    gauden_dist_precompute(g, g->lmath, ps_config_float(config, "varfloor"));
    return 0;
}